

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall Logger::logBreak(Logger *this)

{
  string *psVar1;
  ostream *poVar2;
  
  (this->mLastLog)._M_string_length = 0;
  psVar1 = &this->mLastLog;
  *(this->mLastLog)._M_dataplus._M_p = '\0';
  std::__cxx11::string::resize((ulong)psVar1);
  std::__cxx11::string::assign((ulong)psVar1,-3);
  poVar2 = std::operator<<((ostream *)this,(string *)psVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Logger::logBreak() {
    mLastLog.clear();
    mLastLog.resize(256);
    mLastLog.assign(253, '-');
    mLogStream << mLastLog << std::endl;
}